

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayType.cpp
# Opt level: O3

int __thiscall
hdc::ArrayType::clone(ArrayType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  ArrayType *this_00;
  undefined4 extraout_var;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hadley-siqueira[P]hdc/src/ast/types/ArrayType.cpp"
             ,0x68);
  uStack_18 = CONCAT17(0x20,(undefined7)uStack_18);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)((long)&uStack_18 + 7),1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," please implement me\n",0x15);
  this_00 = (ArrayType *)operator_new(0x58);
  iVar1 = (*(this->subtype->super_ASTNode)._vptr_ASTNode[3])();
  ArrayType(this_00,(Type *)CONCAT44(extraout_var,iVar1),this->expression,&this->token);
  return (int)this_00;
}

Assistant:

Type* ArrayType::clone() {
    std::cout << __FILE__ << ' ' << __LINE__ << " please implement me\n";
    return new ArrayType(subtype->clone(), expression, token);
}